

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

ssize_t __thiscall LongReadsMapper::write(LongReadsMapper *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ofstream *ofs;
  
  ofs = (ofstream *)CONCAT44(in_register_00000034,__fd);
  std::ostream::write((char *)ofs,(long)&this->k);
  std::ostream::write((char *)ofs,(long)&this->max_index_freq);
  std::ostream::write((char *)ofs,(long)&this->min_size);
  std::ostream::write((char *)ofs,(long)&this->min_chain);
  std::ostream::write((char *)ofs,(long)&this->max_jump);
  std::ostream::write((char *)ofs,(long)&this->max_delta_change);
  sdglib::write_flat_vector<LongReadMapping>(ofs,&this->mappings);
  return extraout_RAX;
}

Assistant:

void LongReadsMapper::write(std::ofstream &ofs) {
    ofs.write(reinterpret_cast<const char *>(&k), sizeof(k));
    ofs.write(reinterpret_cast<const char *>(&max_index_freq), sizeof(max_index_freq));
    ofs.write(reinterpret_cast<const char *>(&min_size), sizeof(min_size));
    ofs.write(reinterpret_cast<const char *>(&min_chain), sizeof(min_chain));
    ofs.write(reinterpret_cast<const char *>(&max_jump), sizeof(max_jump));
    ofs.write(reinterpret_cast<const char *>(&max_delta_change), sizeof(max_delta_change));

    sdglib::write_flat_vector(ofs, mappings);
}